

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
wasm::Builder::makeDataSegment
          (Name name,Name memory,bool isPassive,Expression *offset,char *init,Address size)

{
  pointer pDVar1;
  address64_t __new_size;
  iterator __result;
  __uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true> this;
  undefined7 in_register_00000081;
  address64_t in_stack_00000018;
  Address AStack_38;
  bool isPassive_local;
  Address size_local;
  Name memory_local;
  Name name_local;
  __single_object *seg;
  
  size_local.addr = memory.super_IString.str._M_str;
  memory_local.super_IString.str._M_str = name.super_IString.str._M_str;
  this.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t.
  super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
  super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl = name.super_IString.str._M_len;
  memory_local.super_IString.str._M_len = CONCAT71(in_register_00000081,isPassive);
  AStack_38.addr = in_stack_00000018;
  std::make_unique<wasm::DataSegment>();
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  Name::operator=((Name *)pDVar1,(Name *)&memory_local.super_IString.str._M_str);
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  Name::operator=(&pDVar1->memory,(Name *)&size_local);
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  pDVar1->isPassive = (bool)((byte)offset & 1);
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  pDVar1->offset = (Expression *)init;
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  __new_size = Address::operator_cast_to_unsigned_long(&stack0xffffffffffffffc8);
  std::vector<char,_std::allocator<char>_>::resize(&pDVar1->data,__new_size);
  pDVar1 = std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::operator->
                     ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                      this.
                      super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                      .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
  __result = std::vector<char,_std::allocator<char>_>::begin(&pDVar1->data);
  std::
  copy_n<char_const*,wasm::Address,__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((char *)size.addr,AStack_38,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             __result._M_current);
  return (__uniq_ptr_data<wasm::DataSegment,_std::default_delete<wasm::DataSegment>,_true,_true>)
         (tuple<wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>)
         this.super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>._M_t
         .super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>.
         super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl;
}

Assistant:

static std::unique_ptr<DataSegment>
  makeDataSegment(Name name = "",
                  Name memory = "",
                  bool isPassive = false,
                  Expression* offset = nullptr,
                  const char* init = "",
                  Address size = 0) {
    auto seg = std::make_unique<DataSegment>();
    seg->name = name;
    seg->memory = memory;
    seg->isPassive = isPassive;
    seg->offset = offset;
    seg->data.resize(size);
    std::copy_n(init, size, seg->data.begin());
    return seg;
  }